

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_band.c
# Opt level: O0

void SUNDlsMat_bandMatvec
               (sunrealtype **a,sunrealtype *x,sunrealtype *y,sunindextype n,sunindextype mu,
               sunindextype ml,sunindextype smu)

{
  sunrealtype *psVar1;
  long local_68;
  long local_60;
  sunrealtype *col_j;
  sunindextype ie;
  sunindextype is;
  sunindextype j;
  sunindextype i;
  sunindextype ml_local;
  sunindextype mu_local;
  sunindextype n_local;
  sunrealtype *y_local;
  sunrealtype *x_local;
  sunrealtype **a_local;
  
  for (i = 0; i < n; i = i + 1) {
    y[i] = 0.0;
  }
  for (j = 0; j < n; j = j + 1) {
    psVar1 = a[j];
    if (j - mu < 0) {
      local_60 = 0;
    }
    else {
      local_60 = j - mu;
    }
    if (n + -1 < j + ml) {
      local_68 = n + -1;
    }
    else {
      local_68 = j + ml;
    }
    for (i = local_60; i <= local_68; i = i + 1) {
      y[i] = psVar1[smu + (i - j)] * x[j] + y[i];
    }
  }
  return;
}

Assistant:

void SUNDlsMat_bandMatvec(sunrealtype** a, sunrealtype* x, sunrealtype* y,
                          sunindextype n, sunindextype mu, sunindextype ml,
                          sunindextype smu)
{
  sunindextype i, j, is, ie;
  sunrealtype* col_j;

  for (i = 0; i < n; i++) { y[i] = ZERO; }

  for (j = 0; j < n; j++)
  {
    col_j = a[j] + smu - mu;
    is    = (0 > j - mu) ? 0 : j - mu;
    ie    = (n - 1 < j + ml) ? n - 1 : j + ml;
    for (i = is; i <= ie; i++) { y[i] += col_j[i - j + mu] * x[j]; }
  }
}